

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O1

StatusOr<const_google::protobuf::Message_*>
google::protobuf::json_internal::UnparseProto2Descriptor::GetMessage(Field f)

{
  ulong in_RAX;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 extraout_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 extraout_RDX_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 aVar1;
  StatusOr<const_google::protobuf::Message_*> SVar2;
  Status local_18;
  
  local_18.rep_ = in_RAX;
  absl::lts_20240722::InternalError(&local_18,0x23,"message fields cannot have defaults");
  absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
  StatusOrData<absl::lts_20240722::Status,_0>
            ((StatusOrData<const_google::protobuf::Message_*> *)f,&local_18);
  aVar1 = extraout_RDX;
  if ((local_18.rep_ & 1) == 0) {
    absl::lts_20240722::status_internal::StatusRep::Unref();
    aVar1 = extraout_RDX_00;
  }
  SVar2.super_StatusOrData<const_google::protobuf::Message_*>.field_1.data_ = aVar1.data_;
  SVar2.super_StatusOrData<const_google::protobuf::Message_*>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)f;
  return (StatusOr<const_google::protobuf::Message_*>)
         SVar2.super_StatusOrData<const_google::protobuf::Message_*>;
}

Assistant:

static absl::StatusOr<const Msg*> GetMessage(Field f) {
    return absl::InternalError("message fields cannot have defaults");
  }